

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue JS_ToPrimitiveFree(JSContext *ctx,JSValue val,int hint)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  JSValueUnion JVar5;
  JSAtom JVar6;
  ulong uVar7;
  JSRefCountHeader *p_4;
  uint uVar8;
  JSAtom atom;
  JSValueUnion JVar9;
  JSRuntime *rt;
  bool bVar10;
  JSRefCountHeader *p_1;
  JSRefCountHeader *p;
  char cVar11;
  JSValue JVar12;
  JSValue JVar13;
  JSValueUnion local_40;
  int64_t iStack_38;
  
  JVar9 = val.u;
  if ((int)val.tag != -1) {
    uVar7 = (ulong)JVar9.ptr & 0xffffffff00000000;
    goto LAB_00136356;
  }
  uVar8 = hint & 0xffffffef;
  if ((hint & 0x10U) == 0) {
    JVar12 = JS_GetPropertyInternal(ctx,val,0xc5,val,0);
    if ((int)JVar12.tag - 2U < 2) goto LAB_00136070;
    if ((int)JVar12.tag == 6) goto LAB_00136323;
    JVar6 = 0x16;
    if (uVar8 == 1) {
      JVar6 = 0x46;
    }
    atom = 0x48;
    if (uVar8 != 0) {
      atom = JVar6;
    }
    _local_40 = __JS_AtomToValue(ctx,atom,1);
    JVar13 = JS_CallFree(ctx,JVar12,val,1,(JSValue *)&local_40);
    if (0xfffffff4 < local_40._8_4_) {
      iVar2 = *local_40.ptr;
      *(int *)local_40.ptr = iVar2 + -1;
      if (iVar2 < 2) {
        __JS_FreeValueRT(ctx->rt,_local_40);
      }
    }
    if ((JVar13.tag & 0xffffffffU) == 6) goto LAB_00136323;
    iVar2 = *JVar9.ptr;
    *(int *)JVar9.ptr = iVar2 + -1;
    if (iVar2 < 2) {
      __JS_FreeValueRT(ctx->rt,val);
    }
    if ((int)JVar13.tag != -1) {
LAB_00136396:
      uVar7 = (ulong)JVar13.u.ptr & 0xffffffff00000000;
      val = JVar13;
      goto LAB_00136356;
    }
    iVar2 = *JVar13.u.ptr;
    *(int *)JVar13.u.ptr = iVar2 + -1;
    if (iVar2 < 2) {
      __JS_FreeValueRT(ctx->rt,JVar13);
    }
    JS_ThrowTypeError(ctx,"toPrimitive");
  }
  else {
LAB_00136070:
    bVar4 = false;
    bVar3 = true;
    do {
      bVar10 = bVar3;
      JVar12 = JS_GetPropertyInternal(ctx,val,(uint)(bVar4 != (uVar8 != 0)) * 2 + 0x37,val,0);
      JVar5 = JVar12.u;
      if ((JVar12.tag & 0xffffffffU) == 6) goto LAB_00136323;
      if ((uint)JVar12.tag == 0xffffffff) {
        uVar1 = *(ushort *)((long)JVar5.ptr + 6);
        if (uVar1 != 0xd) {
          if (uVar1 == 0x29) {
            cVar11 = *(char *)(*(long *)((long)JVar5.ptr + 0x30) + 0x20);
          }
          else {
            cVar11 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
          }
          if (cVar11 == '\0') goto LAB_0013619f;
        }
        local_40.ptr = (void *)(local_40 << 0x20);
        iStack_38 = 3;
        JVar13.tag = 3;
        JVar13.u.ptr = local_40.ptr;
        JVar13 = JS_CallInternal(ctx,JVar12,val,JVar13,0,(JSValue *)0x0,2);
        iVar2 = *JVar5.ptr;
        *(int *)JVar5.ptr = iVar2 + -1;
        if (iVar2 < 2) {
          __JS_FreeValueRT(ctx->rt,JVar12);
        }
        if ((int)JVar13.tag != -1) {
          if ((int)JVar13.tag == 6) goto LAB_00136323;
          iVar2 = *JVar9.ptr;
          *(int *)JVar9.ptr = iVar2 + -1;
          if (iVar2 < 2) {
            __JS_FreeValueRT(ctx->rt,val);
          }
          goto LAB_00136396;
        }
        iVar2 = *JVar13.u.ptr;
        *(int *)JVar13.u.ptr = iVar2 + -1;
        if (iVar2 < 2) {
          rt = ctx->rt;
          JVar12 = JVar13;
          goto LAB_001361bf;
        }
      }
      else {
LAB_0013619f:
        if ((0xfffffff4 < (uint)JVar12.tag) &&
           (iVar2 = *JVar5.ptr, *(int *)JVar5.ptr = iVar2 + -1, iVar2 < 2)) {
          rt = ctx->rt;
LAB_001361bf:
          __JS_FreeValueRT(rt,JVar12);
        }
      }
      bVar4 = true;
      bVar3 = false;
    } while (bVar10);
    JS_ThrowTypeError(ctx,"toPrimitive");
LAB_00136323:
    iVar2 = *JVar9.ptr;
    *(int *)JVar9.ptr = iVar2 + -1;
    if (iVar2 < 2) {
      __JS_FreeValueRT(ctx->rt,val);
    }
  }
  uVar7 = 0;
  val = (JSValue)(ZEXT816(6) << 0x40);
LAB_00136356:
  JVar12.u.ptr = (void *)((ulong)val.u.ptr & 0xffffffff | uVar7);
  JVar12.tag = val.tag;
  return JVar12;
}

Assistant:

static JSValue JS_ToPrimitiveFree(JSContext *ctx, JSValue val, int hint)
{
    int i;
    BOOL force_ordinary;

    JSAtom method_name;
    JSValue method, ret;
    if (JS_VALUE_GET_TAG(val) != JS_TAG_OBJECT)
        return val;
    force_ordinary = hint & HINT_FORCE_ORDINARY;
    hint &= ~HINT_FORCE_ORDINARY;
    if (!force_ordinary) {
        method = JS_GetProperty(ctx, val, JS_ATOM_Symbol_toPrimitive);
        if (JS_IsException(method))
            goto exception;
        /* ECMA says *If exoticToPrim is not undefined* but tests in
           test262 use null as a non callable converter */
        if (!JS_IsUndefined(method) && !JS_IsNull(method)) {
            JSAtom atom;
            JSValue arg;
            switch(hint) {
            case HINT_STRING:
                atom = JS_ATOM_string;
                break;
            case HINT_NUMBER:
                atom = JS_ATOM_number;
                break;
            default:
            case HINT_NONE:
                atom = JS_ATOM_default;
                break;
            }
            arg = JS_AtomToString(ctx, atom);
            ret = JS_CallFree(ctx, method, val, 1, (JSValueConst *)&arg);
            JS_FreeValue(ctx, arg);
            if (JS_IsException(ret))
                goto exception;
            JS_FreeValue(ctx, val);
            if (JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT)
                return ret;
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "toPrimitive");
        }
    }
    if (hint != HINT_STRING)
        hint = HINT_NUMBER;
    for(i = 0; i < 2; i++) {
        if ((i ^ hint) == 0) {
            method_name = JS_ATOM_toString;
        } else {
            method_name = JS_ATOM_valueOf;
        }
        method = JS_GetProperty(ctx, val, method_name);
        if (JS_IsException(method))
            goto exception;
        if (JS_IsFunction(ctx, method)) {
            ret = JS_CallFree(ctx, method, val, 0, NULL);
            if (JS_IsException(ret))
                goto exception;
            if (JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT) {
                JS_FreeValue(ctx, val);
                return ret;
            }
            JS_FreeValue(ctx, ret);
        } else {
            JS_FreeValue(ctx, method);
        }
    }
    JS_ThrowTypeError(ctx, "toPrimitive");
exception:
    JS_FreeValue(ctx, val);
    return JS_EXCEPTION;
}